

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cfft2i_(int *l,int *m,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  int i__1;
  int ier1;
  double *local_38;
  
  *ier = 0;
  iVar4 = *lensav;
  iVar1 = *l;
  local_38 = wsave;
  dVar5 = log((double)iVar1);
  iVar2 = *m;
  dVar6 = log((double)iVar2);
  if (iVar4 < (int)(dVar6 / 0.6931471805599453) +
              (int)(dVar5 / 0.6931471805599453) + (iVar1 + iVar2) * 2 + 8) {
    iVar4 = 2;
  }
  else {
    iVar4 = *l;
    dVar5 = log((double)iVar4);
    i__1 = (int)(dVar5 / 0.6931471805599453) + iVar4 * 2 + 4;
    cfftmi_(l,local_38,&i__1,&ier1);
    pdVar3 = local_38;
    iVar4 = 0x14;
    if (ier1 == 0) {
      iVar1 = *m;
      dVar5 = log((double)iVar1);
      i__1 = (int)(dVar5 / 0.6931471805599453) + iVar1 * 2 + 4;
      iVar1 = *l;
      dVar5 = log((double)iVar1);
      cfftmi_(m,pdVar3 + (long)((int)(dVar5 / 0.6931471805599453) + iVar1 * 2) + 2,&i__1,&ier1);
      if (ier1 == 0) {
        return 0;
      }
    }
  }
  *ier = iVar4;
  return 0;
}

Assistant:

int cfft2i_(int *l, int *m, fft_real_t *wsave, int *
	lensav, int *ier)
{
    /* System generated locals */
    int i__1;

    /* Builtin functions */


    /* Local variables */
     int ier1;
    extern /* Subroutine */ int cfftmi_(int *, fft_real_t *, int *, int
	    *), xerfft_(char *, int *, ftnlen);


/* Initialize error return */

    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + (*m <<
	     1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 8) {
	*ier = 2;
	//xerfft_("CFFT2I", &c__4, (ftnlen)6);
	goto L100;
    }

    i__1 = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    cfftmi_(l, &wsave[1], &i__1, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("CFFT2I", &c_n5, (ftnlen)6);
	goto L100;
    }
    i__1 = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    cfftmi_(m, &wsave[(*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 3]
	    , &i__1, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("CFFT2I", &c_n5, (ftnlen)6);
    }

L100:
    return 0;
}